

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.hpp
# Opt level: O2

result_type
boost::numeric::ublas::
vector_inner_prod<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,double>
::
apply<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::const_iterator,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>::const_iterator>
          (long *it1,long it1_end,long it2,long it2_end)

{
  const_iterator2 *this;
  undefined1 auVar1 [16];
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  long lVar5;
  size_type *psVar6;
  result_type rVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  
  psVar6 = (size_type *)it1[1];
  rVar7 = 0.0;
  auVar9 = ZEXT864(0) << 0x40;
  if ((psVar6 != *(size_type **)(it1_end + 8)) &&
     (*(long *)(it2 + 0x10) != *(long *)(it2_end + 0x10))) {
    this = (const_iterator2 *)(it2 + 8);
    do {
      rVar7 = auVar9._0_8_;
      while (sVar4 = *psVar6,
            sVar3 = matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::const_iterator2::index2(this), sVar4 != sVar3) {
        uVar2 = *(ulong *)it1[1];
        sVar4 = matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                ::const_iterator2::index2(this);
        if (uVar2 < sVar4) {
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator2::index2(this);
          psVar6 = (size_type *)(it1[1] + 8);
          it1[1] = (long)psVar6;
          if (psVar6 == *(size_type **)(it1_end + 8)) {
            return rVar7;
          }
        }
        else {
          uVar2 = *(ulong *)it1[1];
          sVar4 = matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::const_iterator2::index2(this);
          psVar6 = (size_type *)it1[1];
          if (sVar4 < uVar2) {
            sVar4 = *psVar6;
            sVar3 = matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::const_iterator2::index2(this);
            lVar5 = *(long *)(it2_end + 0x10) - *(long *)(it2 + 0x10) >> 3;
            if ((long)(sVar4 - sVar3) <= lVar5) {
              lVar5 = sVar4 - sVar3;
            }
            lVar5 = *(long *)(it2 + 0x10) + lVar5 * 8;
            *(long *)(it2 + 0x10) = lVar5;
            if (lVar5 == *(long *)(it2_end + 0x10)) {
              return rVar7;
            }
            psVar6 = (size_type *)it1[1];
          }
        }
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = rVar7;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(*(long *)(*it1 + 0x40) + (it1[1] - *(long *)(*it1 + 0x28)));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = **(ulong **)(it2 + 0x10);
      auVar1 = vfmadd231sd_fma(auVar10,auVar8,auVar1);
      it1[1] = it1[1] + 8;
      lVar5 = *(long *)(it2 + 0x10) + 8;
      *(long *)(it2 + 0x10) = lVar5;
      psVar6 = (size_type *)it1[1];
      auVar9 = ZEXT1664(auVar1);
      rVar7 = auVar1._0_8_;
    } while ((psVar6 != *(size_type **)(it1_end + 8)) && (lVar5 != *(long *)(it2_end + 0x10)));
  }
  return rVar7;
}

Assistant:

static BOOST_UBLAS_INLINE
        result_type apply (I1 it1, const I1 &it1_end, I2 it2, const I2 &it2_end, sparse_bidirectional_iterator_tag) {
            result_type t = result_type (0);
            if (it1 != it1_end && it2 != it2_end) {
                while (true) {
                    if (it1.index () == it2.index ()) {
                        t += *it1 * *it2, ++ it1, ++ it2;
                        if (it1 == it1_end || it2 == it2_end)
                            break;
                    } else if (it1.index () < it2.index ()) {
                        increment (it1, it1_end, it2.index () - it1.index ());
                        if (it1 == it1_end)
                            break;
                    } else if (it1.index () > it2.index ()) {
                        increment (it2, it2_end, it1.index () - it2.index ());
                        if (it2 == it2_end)
                            break;
                    }
                }
            }
            return t;
        }